

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O1

bool __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_>::
normalize_rec(miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_> *this,
             spectrum *lspec,uint v)

{
  int iVar1;
  int *piVar2;
  key_type kVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  spectral_operation sVar7;
  iterator __begin2;
  int *piVar8;
  pointer piVar9;
  mapped_type *pmVar10;
  undefined7 extraout_var;
  long lVar11;
  undefined4 in_register_00000014;
  ulong uVar12;
  uint i;
  ulong uVar13;
  uint uVar14;
  uint j;
  int iVar15;
  int iVar16;
  vector<int,_std::allocator<int>_> *__range2;
  bool bVar17;
  char cVar18;
  undefined8 local_70;
  undefined4 local_64;
  undefined8 local_60;
  uint local_58;
  uint local_54;
  mapped_type *local_50;
  ulong local_48;
  ulong local_40;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_kitty::detail::spectrum>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_38;
  
  local_60 = CONCAT44(in_register_00000014,v);
  uVar6 = this->step_counter + 1;
  this->step_counter = uVar6;
  if (uVar6 == this->step_limit) {
    bVar4 = 0;
    goto LAB_001050c5;
  }
  if (this->num_vars_exp == v) {
    if ((this->hasOutputNegation == true) &&
       (piVar8 = (lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start, *piVar8 < 0)) {
      piVar2 = (lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (; piVar8 != piVar2; piVar8 = piVar8 + 1) {
        *piVar8 = -*piVar8;
      }
      uVar13 = local_70 >> 0x20;
      local_70 = CONCAT44((uint)uVar13 & 0xffff0000,3);
      insert(this,(spectral_operation *)&local_70);
    }
    if ((this->hasInputNegation == true) && (1 < this->num_vars_exp)) {
      uVar13 = 1;
      do {
        kVar3 = local_70;
        uVar6 = (uint)uVar13;
        piVar9 = (lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar9[uVar13] < 0) {
          lVar11 = (long)(lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar9;
          if (lVar11 != 0) {
            uVar13 = 0;
            do {
              if (((uint)uVar13 & uVar6) != 0) {
                piVar9[uVar13] = -piVar9[uVar13];
              }
              uVar13 = uVar13 + 1;
            } while ((uVar13 & 0xffffffff) < (ulong)(lVar11 >> 2));
          }
          local_70._6_2_ = SUB82(kVar3,6);
          local_70._0_6_ = (spectral_operation)CONCAT24(0,uVar6 << 0x10 | 2);
          insert(this,(spectral_operation *)&local_70);
        }
        uVar13 = (ulong)(uVar6 * 2);
      } while (uVar6 * 2 < this->num_vars_exp);
    }
    closer(this,(UI *)lspec);
  }
  else {
    iVar16 = 0;
    for (piVar8 = (lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + v;
        piVar8 != (lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar8 = piVar8 + 1) {
      iVar1 = *piVar8;
      iVar15 = -iVar1;
      if (0 < iVar1) {
        iVar15 = iVar1;
      }
      if (iVar16 < iVar15) {
        iVar16 = iVar15;
      }
    }
    if (iVar16 == 0) {
      local_70 = (ulong)this->num_vars_exp;
      pmVar10 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_kitty::detail::spectrum>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_kitty::detail::spectrum>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&this->specs,&local_70);
      if (pmVar10 != lspec) {
        std::vector<int,_std::allocator<int>_>::operator=(&pmVar10->_s,&lspec->_s);
      }
      bVar5 = normalize_rec(this,pmVar10,this->num_vars_exp);
      if (!bVar5) {
        bVar4 = 0;
        goto LAB_001050c5;
      }
    }
    else {
      piVar9 = (lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar17 = (ulong)((long)(lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar9) < 5;
      bVar5 = !bVar17;
      if (bVar17) {
        local_64 = SUB84(piVar9,0);
      }
      else {
        local_54 = -v;
        local_38 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_kitty::detail::spectrum>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->specs;
        uVar13 = (ulong)(v * 2);
        local_48 = 1;
        local_64 = SUB84(local_38,0);
        local_50 = lspec;
        local_40 = uVar13;
        do {
          uVar6 = (this->order).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[local_48];
          iVar1 = piVar9[uVar6];
          iVar15 = -iVar1;
          if (0 < iVar1) {
            iVar15 = iVar1;
          }
          cVar18 = '\a';
          if ((iVar15 == iVar16) && (uVar14 = uVar6 & local_54, uVar14 != 0)) {
            local_70 = uVar13;
            pmVar10 = std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_kitty::detail::spectrum>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::at(local_38,&local_70);
            if (pmVar10 != lspec) {
              std::vector<int,_std::allocator<int>_>::operator=(&pmVar10->_s,&lspec->_s);
            }
            uVar14 = -uVar14 & uVar14;
            local_58 = this->transform_index;
            if (uVar14 != uVar6) {
              uVar6 = uVar6 ^ uVar14;
              do {
                j = -uVar6 & uVar6;
                sVar7 = spectrum::spectral_translation(pmVar10,uVar14,j);
                local_70 = CONCAT26(local_70._6_2_,sVar7);
                insert(this,(spectral_operation *)&local_70);
                bVar17 = j != uVar6;
                uVar6 = j ^ uVar6;
              } while (bVar17);
            }
            if (uVar14 != (uint)local_60) {
              sVar7 = spectrum::permutation(pmVar10,uVar14,(uint)local_60);
              local_70 = CONCAT26(local_70._6_2_,sVar7);
              insert(this,(spectral_operation *)&local_70);
            }
            uVar13 = local_40;
            bVar17 = normalize_rec(this,pmVar10,(uint)local_40);
            cVar18 = !bVar17;
            lspec = local_50;
            if ((bool)cVar18) {
              local_64 = (undefined4)CONCAT71(extraout_var,bVar17);
            }
            else {
              this->transform_index = local_58;
            }
          }
          if ((cVar18 != '\a') && (cVar18 != '\0')) break;
          local_48 = (ulong)((int)local_48 + 1);
          piVar9 = (lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar12 = (long)(lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar9 >> 2;
          bVar5 = local_48 < uVar12;
        } while (local_48 < uVar12);
      }
      bVar4 = (byte)local_64;
      if (bVar5) goto LAB_001050c5;
    }
  }
  bVar4 = 1;
LAB_001050c5:
  return (bool)(bVar4 & 1);
}

Assistant:

bool normalize_rec( spectrum& lspec, unsigned v )
  {
    if ( ++step_counter == step_limit )
      return false;

    if ( v == num_vars_exp ) /* leaf case */
    {
      /* invert function if necessary */
      if ( hasOutputNegation && lspec[0u] < 0 )
      {
        insert( lspec.output_negation() );
      }
      /* invert any variable as necessary */
      if ( hasInputNegation )
      {
        for ( auto i = 1u; i < num_vars_exp; i <<= 1 )
        {
          if ( lspec[i] < 0 )
          {
            insert( lspec.input_negation( i ) );
          }
        }
      }

      closer( lspec );
      return true;
    }

    auto min = 0, max = 0;
    const auto p = std::accumulate( lspec.cbegin() + v, lspec.cend(),
                                    std::make_pair( min, max ),
                                    []( auto a, auto sv )
                                    {
                                      return std::make_pair( std::min( a.first, abs( sv ) ), std::max( a.second, abs( sv ) ) );
                                    } );
    min = p.first;
    max = p.second;

    if ( max == 0 )
    {
      auto& spec2 = specs.at( num_vars_exp );
      spec2 = lspec;
      if ( !normalize_rec( spec2, num_vars_exp ) )
        return false;
    }
    else
    {
      for ( auto i = 1u; i < lspec.size(); ++i )
      {
        auto j = order[i];
        if ( abs( lspec[j] ) != max )
        {
          continue;
        }

        /* k = first one bit in j starting from pos v */
        auto k = j & ~( v - 1 ); /* remove 1 bits until v */
        if ( k == 0 )
        {
          continue; /* are there bit left? */
        }
        k = k - ( k & ( k - 1 ) ); /* extract lowest bit */
        j ^= k;                    /* remove bit k from j */

        auto& spec2 = specs.at( v << 1 );
        spec2 = lspec;

        const auto save = transform_index;

        /* spectral translation to all other 1s in j */
        while ( j )
        {
          auto p = j - ( j & ( j - 1 ) );
          insert( spec2.spectral_translation( k, p ) );
          j ^= p;
        }

        if ( k != v )
        {
          insert( spec2.permutation( k, v ) );
        }

        if ( !normalize_rec( spec2, v << 1 ) )
          return false;

        if ( v == 1 && min == max )
        {
          return true;
        }
        transform_index = save;
      }
    }

    return true;
  }